

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

size_t pbrt::
       FindInterval<pbrt::SampleCatmullRom2D(pstd::span<float_const>,pstd::span<float_const>,pstd::span<float_const>,pstd::span<float_const>,float,float,float*,float*)::__1>
                 (size_t size_,anon_class_24_3_fe2b71c8 *pred)

{
  bool bVar1;
  anon_class_24_3_fe2b71c8 *this;
  size_t sVar2;
  long in_RDI;
  bool predResult;
  size_t middle;
  size_t half;
  ssize_t first;
  ssize_t size;
  ulong local_48;
  undefined1 *local_40;
  int in_stack_ffffffffffffffcc;
  undefined1 *local_20;
  ulong local_18;
  
  local_20 = (undefined1 *)0x1;
  local_18 = in_RDI - 2;
  while (0 < (long)local_18) {
    local_48 = local_18 >> 1;
    this = (anon_class_24_3_fe2b71c8 *)(local_20 + local_48);
    bVar1 = SampleCatmullRom2D::anon_class_24_3_fe2b71c8::operator()(this,in_stack_ffffffffffffffcc)
    ;
    in_stack_ffffffffffffffcc = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffcc);
    if (bVar1) {
      local_40 = (undefined1 *)((long)&this->interpolate + 1);
    }
    else {
      local_40 = local_20;
    }
    local_20 = local_40;
    if (bVar1) {
      local_48 = local_18 - (local_48 + 1);
    }
    local_18 = local_48;
  }
  sVar2 = Clamp<long,int,unsigned_long>((long)(local_20 + -1),0,in_RDI - 2);
  return sVar2;
}

Assistant:

PBRT_CPU_GPU inline size_t FindInterval(size_t size_, const Predicate &pred) {
    using ssize_t = std::make_signed_t<size_t>;  // Not all platforms have ssize_t
    ssize_t size = (ssize_t)size_ - 2, first = 1;

    while (size > 0) {
        size_t half = (size_t)size >> 1, middle = first + half;

        // .. and recurse into the left or right side
        bool predResult = pred(middle);
        first = predResult ? middle + 1 : first;
        size = predResult ? size - (half + 1) : half;
    }

    return (size_t)Clamp((ssize_t)first - 1, 0, size_ - 2);
}